

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  string *psVar2;
  bool bVar3;
  _Setw _Var4;
  ostream *poVar5;
  ulong uVar6;
  reference pcVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t wid_local;
  string *description_local;
  string *name_local;
  ostream *out_local;
  
  local_28 = wid;
  wid_local = (size_t)description;
  description_local = name;
  name_local = (string *)out;
  ::std::operator+(&local_48,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  psVar2 = name_local;
  _Var4 = std::setw((int)local_28);
  poVar5 = ::std::operator<<((ostream *)psVar2,_Var4);
  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,std::left);
  ::std::operator<<(poVar5,(string *)name);
  uVar6 = ::std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    uVar6 = ::std::__cxx11::string::length();
    if (local_28 <= uVar6) {
      poVar5 = ::std::operator<<((ostream *)name_local,"\n");
      _Var4 = std::setw((int)local_28);
      poVar5 = ::std::operator<<(poVar5,_Var4);
      ::std::operator<<(poVar5,"");
    }
    __end3._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_68._M_current = (char *)::std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff98), bVar3) {
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3);
      cVar1 = *pcVar7;
      ::std::ostream::put((char)name_local);
      psVar2 = name_local;
      if (cVar1 == '\n') {
        _Var4 = std::setw((int)local_28);
        poVar5 = ::std::operator<<((ostream *)psVar2,_Var4);
        ::std::operator<<(poVar5,"");
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
  }
  ::std::operator<<((ostream *)name_local,"\n");
  return (ostream *)name_local;
}

Assistant:

inline std::ostream &format_help(std::ostream &out, std::string name, std::string description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}